

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_image.cxx
# Opt level: O0

void __thiscall
Fl_PostScript_Graphics_Driver::draw_image_mono
          (Fl_PostScript_Graphics_Driver *this,Fl_Draw_Image_Cb call,void *data,int ix,int iy,int iw
          ,int ih,int D)

{
  uchar b;
  uchar *puVar1;
  void *data_00;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  uchar *local_90;
  uchar *curdata;
  void *big;
  uchar *curmask;
  uchar *rgbdata;
  char *pcStack_68;
  int LD;
  char *interpol;
  int local_58;
  int k;
  int j;
  int i;
  double h;
  double w;
  double y;
  double x;
  int iw_local;
  int iy_local;
  int ix_local;
  void *data_local;
  Fl_Draw_Image_Cb call_local;
  Fl_PostScript_Graphics_Driver *this_local;
  
  dVar2 = (double)ix;
  dVar3 = (double)iy;
  dVar4 = (double)iw;
  dVar5 = (double)ih;
  fprintf((FILE *)this->output,"save\n");
  if (this->lang_level_ < 2) {
    fprintf((FILE *)this->output,"%g %g %g %g %i %i GI",dVar2,dVar3 + dVar5,dVar4,-dVar5,
            (ulong)(uint)iw,(ulong)(uint)ih);
  }
  else {
    if (this->interpolate_ == 0) {
      pcStack_68 = "false";
    }
    else {
      pcStack_68 = "true";
    }
    if ((this->mask == (uchar *)0x0) || (this->lang_level_ < 3)) {
      fprintf((FILE *)this->output,"%g %g %g %g %i %i %s GII\n",dVar2,dVar3 + dVar5,dVar4,-dVar5,
              (ulong)(uint)iw,(ulong)(uint)ih,pcStack_68);
    }
    else {
      fprintf((FILE *)this->output,"%g %g %g %g %i %i %i %i %s GIM\n",dVar2,dVar3 + dVar5,dVar4,
              -dVar5,(ulong)(uint)iw,(ulong)(uint)ih,(ulong)(uint)this->mx,(ulong)(uint)this->my,
              pcStack_68);
    }
  }
  puVar1 = (uchar *)operator_new__((long)(iw * D));
  big = this->mask;
  data_00 = prepare_rle85(this);
  for (local_58 = 0; local_58 < ih; local_58 = local_58 + 1) {
    if ((this->mask != (uchar *)0x0) && (2 < this->lang_level_)) {
      for (interpol._4_4_ = 0; interpol._4_4_ < this->my / ih; interpol._4_4_ = interpol._4_4_ + 1)
      {
        for (k = 0; k < (this->mx + 7) / 8; k = k + 1) {
          b = swap_byte(*big);
          write_rle85(this,b,data_00);
          big = (void *)((long)big + 1);
        }
      }
    }
    (*call)(data,0,local_58,iw,puVar1);
    local_90 = puVar1;
    for (k = 0; k < iw; k = k + 1) {
      write_rle85(this,*local_90,data_00);
      local_90 = local_90 + D;
    }
  }
  close_rle85(this,data_00);
  fprintf((FILE *)this->output,"restore\n");
  if (puVar1 != (uchar *)0x0) {
    operator_delete__(puVar1);
  }
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::draw_image_mono(Fl_Draw_Image_Cb call, void *data, int ix, int iy, int iw, int ih, int D) {
  double x = ix, y = iy, w = iw, h = ih;

  fprintf(output,"save\n");
  int i,j,k;
  const char * interpol;
  if (lang_level_>1){
    if (interpolate_) interpol="true";
    else interpol="false";
    if (mask && lang_level_>2)
      fprintf(output, "%g %g %g %g %i %i %i %i %s GIM\n", x , y+h , w , -h , iw , ih, mx, my, interpol);
    else
      fprintf(output, "%g %g %g %g %i %i %s GII\n", x , y+h , w , -h , iw , ih, interpol);
  } else
    fprintf(output , "%g %g %g %g %i %i GI", x , y+h , w , -h , iw , ih);

  int LD=iw*D;
  uchar *rgbdata=new uchar[LD];
  uchar *curmask=mask;
  void *big = prepare_rle85();
  for (j=0; j<ih;j++){

    if (mask && lang_level_>2){  // InterleaveType 2 mask data
      for (k=0; k<my/ih;k++){ //for alpha pseudo-masking
        for (i=0; i<((mx+7)/8);i++){
          write_rle85(swap_byte(*curmask), big);
          curmask++;
        }
      }
    }
    call(data,0,j,iw,rgbdata);
    uchar *curdata=rgbdata;
    for (i=0 ; i<iw ; i++) {
      write_rle85(curdata[0], big);
      curdata +=D;
    }
  }
  close_rle85(big);
  fprintf(output,"restore\n");
  delete[] rgbdata;
}